

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool icu_63::number::impl::GeneratorHelpers::notation
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  NotationType NVar1;
  UNumberCompactStyle UVar2;
  UErrorCode *extraout_RDX;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68 [5];
  char16_t *local_40;
  char16_t *local_30;
  
  NVar1 = (macros->notation).fType;
  if (NVar1 != NTN_SCIENTIFIC) {
    if (NVar1 != NTN_COMPACT) {
      return false;
    }
    UVar2 = (macros->notation).fUnion.compactStyle;
    if (UVar2 == UNUM_SHORT) {
      local_70.p_ = L"compact-short";
      icu_63::UnicodeString::append(sb,&local_70,-1);
    }
    else {
      if (UVar2 != UNUM_LONG) {
        *status = U_UNSUPPORTED_ERROR;
        return false;
      }
      local_68[0].p_ = L"compact-long";
      icu_63::UnicodeString::append(sb,local_68,-1);
    }
    return true;
  }
  if ((macros->notation).fUnion.scientific.fEngineeringInterval == '\x03') {
    local_78.p_ = L"engineering";
    icu_63::UnicodeString::append(sb,&local_78,-1);
    local_40 = local_78.p_;
  }
  else {
    local_80.p_ = L"scientific";
    icu_63::UnicodeString::append(sb,&local_80,-1);
    local_30 = local_80.p_;
  }
  if (1 < (macros->notation).fUnion.scientific.fMinExponentDigits) {
    icu_63::UnicodeString::append(sb,L'/');
    blueprint_helpers::generateExponentWidthOption
              ((int)(macros->notation).fUnion.scientific.fMinExponentDigits,sb,extraout_RDX);
    if (U_ZERO_ERROR < *status) {
      return false;
    }
  }
  if ((macros->notation).fUnion.scientific.fExponentSignDisplay == UNUM_SIGN_AUTO) {
    return true;
  }
  icu_63::UnicodeString::append(sb,L'/');
  enum_to_stem_string::signDisplay((macros->notation).fUnion.scientific.fExponentSignDisplay,sb);
  return true;
}

Assistant:

bool GeneratorHelpers::notation(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.notation.fType == Notation::NTN_COMPACT) {
        UNumberCompactStyle style = macros.notation.fUnion.compactStyle;
        if (style == UNumberCompactStyle::UNUM_LONG) {
            sb.append(u"compact-long", -1);
            return true;
        } else if (style == UNumberCompactStyle::UNUM_SHORT) {
            sb.append(u"compact-short", -1);
            return true;
        } else {
            // Compact notation generated from custom data (not supported in skeleton)
            // The other compact notations are literals
            status = U_UNSUPPORTED_ERROR;
            return false;
        }
    } else if (macros.notation.fType == Notation::NTN_SCIENTIFIC) {
        const Notation::ScientificSettings& impl = macros.notation.fUnion.scientific;
        if (impl.fEngineeringInterval == 3) {
            sb.append(u"engineering", -1);
        } else {
            sb.append(u"scientific", -1);
        }
        if (impl.fMinExponentDigits > 1) {
            sb.append(u'/');
            blueprint_helpers::generateExponentWidthOption(impl.fMinExponentDigits, sb, status);
            if (U_FAILURE(status)) {
                return false;
            }
        }
        if (impl.fExponentSignDisplay != UNUM_SIGN_AUTO) {
            sb.append(u'/');
            enum_to_stem_string::signDisplay(impl.fExponentSignDisplay, sb);
        }
        return true;
    } else {
        // Default value is not shown in normalized form
        return false;
    }
}